

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Kernel::Clause*>::
loadFromIterator<Lib::IterTraits<Lib::List<Kernel::Clause*>::DestructiveIterator>>
          (Stack<Kernel::Clause*> *this,
          IterTraits<Lib::List<Kernel::Clause_*>::DestructiveIterator> it)

{
  Clause *pCVar1;
  List<Kernel::Clause_*> *pLVar2;
  void **head;
  undefined8 *puVar3;
  
  if (it._iter._lst != (List<Kernel::Clause_*> *)0x0) {
    do {
      pCVar1 = ((List<Kernel::Clause_*> *)it._iter._lst)->_head;
      pLVar2 = ((List<Kernel::Clause_*> *)it._iter._lst)->_tail;
      ((List<Kernel::Clause_*> *)it._iter._lst)->_head =
           (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      puVar3 = *(undefined8 **)(this + 0x10);
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = it._iter._lst;
      if (puVar3 == *(undefined8 **)(this + 0x18)) {
        Stack<Kernel::Clause_*>::expand((Stack<Kernel::Clause_*> *)this);
        puVar3 = *(undefined8 **)(this + 0x10);
      }
      *puVar3 = pCVar1;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 8;
      it._iter._lst = (DestructiveIterator)(DestructiveIterator)pLVar2;
    } while (pLVar2 != (List<Kernel::Clause_*> *)0x0);
  }
  return;
}

Assistant:

static bool isNonEmpty (const List* l)
  {
    return l != 0;
  }